

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O2

void ConstructTtPath::Finish(json *quadContour)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int iVar6;
  size_type idx;
  double dVar7;
  double dVar8;
  Point p3;
  Point p2;
  Point p1;
  Point local_48;
  Point local_38;
  
  sVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size(quadContour);
  if (1 < sVar3) {
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,0);
    Point::Point(&local_38,pvVar4);
    idx = sVar3 - 1;
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,idx);
    Point::Point(&local_48,pvVar4);
    if (SQRT((local_38.x - local_48.x) * (local_38.x - local_48.x) +
             (local_38.y - local_48.y) * (local_38.y - local_48.y)) < 1.0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::erase(quadContour,idx);
      sVar3 = idx;
    }
    if (2 < sVar3) {
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,1);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar4,"on");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,sVar3 - 1);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar5,"on");
      bVar1 = nlohmann::operator!=(pvVar4,pvVar5);
      if (!bVar1) {
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,1);
        Point::Point(&p1,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,0);
        Point::Point(&p2,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,sVar3 - 1);
        Point::Point(&p3,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,1);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar4,"on");
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<bool,_bool,_0>(pvVar4);
        if (bVar1) {
          dVar7 = p3.y - p1.y;
          dVar8 = p1.x - p3.x;
          iVar2 = (int)(p2.x * dVar7 + p2.y * dVar8 + p3.x * p1.y + -p1.x * p3.y);
          iVar6 = -iVar2;
          if (0 < iVar2) {
            iVar6 = iVar2;
          }
          dVar7 = (double)iVar6 / SQRT(dVar7 * dVar7 + dVar8 * dVar8);
        }
        else {
          dVar7 = (p1.x + p3.x) * 0.5 - p2.x;
          dVar8 = (p1.y + p3.y) * 0.5 - p2.y;
          dVar7 = SQRT(dVar7 * dVar7 + dVar8 * dVar8);
        }
        if (dVar7 < 1.0) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::erase(quadContour,0);
        }
      }
    }
  }
  return;
}

Assistant:

void Finish(json &quadContour)
{
	size_t length = quadContour.size();
	// quadContour[0] and quadContour[-1] are implicitly on-curve
	if (length >= 2 && abs(Point(quadContour[0]) - quadContour[length - 1]) < 1)
	{
		quadContour.erase(length - 1);
		length--;
	}
	if (length <= 2)
		return;
	if (quadContour[1]["on"] != quadContour[length - 1]["on"])
		// first point is tangent point, do nothing
		return;
	Point p1 = quadContour[1];
	Point p2 = quadContour[0];
	Point p3 = quadContour[length - 1];
	if (quadContour[1]["on"])
	{
		// 2 lines, merge if the are collinear.
		double a = p3.y - p1.y;
		double b = p1.x - p3.x;
		double c = p1.y * p3.x - p1.x * p3.y;
		double distance = abs(a * p2.x + b * p2.y + c) / sqrt(a * a + b * b);
		if (distance < 1)
			quadContour.erase(0);
	}
	else if (abs((p1 + p3) / 2 - p2) < 1)
		// 2 curves, remove on-curve point if it is the center point
		quadContour.erase(0);
}